

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void build_d_d_ea(m68k_info *info,int opcode,int size)

{
  uint uVar1;
  cs_m68k *pcVar2;
  
  uVar1 = read_imm_16(info);
  pcVar2 = build_init_op(info,0x2b,3,opcode);
  pcVar2->operands[0].address_mode = M68K_AM_REG_DIRECT_DATA;
  pcVar2->operands[0].field_0.reg = (uVar1 & 7) + M68K_REG_D0;
  pcVar2->operands[1].address_mode = M68K_AM_REG_DIRECT_DATA;
  pcVar2->operands[1].field_0.reg = (uVar1 >> 6 & 7) + M68K_REG_D0;
  get_ea_mode_op(info,pcVar2->operands + 2,info->ir,opcode);
  return;
}

Assistant:

static void build_d_d_ea(m68k_info *info, int opcode, int size)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k_op* op2;
	uint extension = read_imm_16(info);
	cs_m68k* ext = build_init_op(info, opcode, 3, size);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];
	op2 = &ext->operands[2];

	op0->address_mode = M68K_AM_REG_DIRECT_DATA;
	op0->reg = M68K_REG_D0 + (extension & 7);

	op1->address_mode = M68K_AM_REG_DIRECT_DATA;
	op1->reg = M68K_REG_D0 + ((extension >> 6) & 7);

	get_ea_mode_op(info, op2, info->ir, size);
}